

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

void __thiscall
icu_63::DayPeriodRulesCountSink::put
          (DayPeriodRulesCountSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  undefined7 in_register_00000009;
  int i;
  ResourceTable rules;
  char *local_58;
  ResourceTable local_50;
  
  local_58 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_50,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = ResourceTable::getKeyAndValue(&local_50,0,&local_58,value);
    if (UVar1 != '\0') {
      i = 1;
      do {
        iVar2 = DayPeriodRulesDataSink::parseSetNum(local_58,errorCode);
        if (*(int *)((anonymous_namespace)::data + 0x10) < iVar2) {
          *(int32_t *)((anonymous_namespace)::data + 0x10) = iVar2;
        }
        UVar1 = ResourceTable::getKeyAndValue(&local_50,i,&local_58,value);
        i = i + 1;
      } while (UVar1 != '\0');
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable rules = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; rules.getKeyAndValue(i, key, value); ++i) {
            int32_t setNum = DayPeriodRulesDataSink::parseSetNum(key, errorCode);
            if (setNum > data->maxRuleSetNum) {
                data->maxRuleSetNum = setNum;
            }
        }
    }